

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexTransformPhase(Abc_Cex_t *p,int nPisOld,int nPosOld,int nRegsOld)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  int nPosNew;
  int nFrames;
  Abc_Cex_t *pCex;
  int nRegsOld_local;
  int nPosOld_local;
  int nPisOld_local;
  Abc_Cex_t *p_local;
  
  iVar1 = p->nPis / nPisOld;
  if (p->nPis % nPisOld != 0) {
    __assert_fail("p->nPis % nPisOld == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                  ,0x196,"Abc_Cex_t *Abc_CexTransformPhase(Abc_Cex_t *, int, int, int)");
  }
  if (p->iPo < nPosOld * iVar1) {
    pAVar2 = Abc_CexDup(p,nRegsOld);
    pAVar2->nPis = nPisOld;
    pAVar2->iPo = -1;
    pAVar2->iFrame = (p->iFrame + 1) * iVar1 + -1;
    pAVar2->nBits = p->nBits;
    return pAVar2;
  }
  __assert_fail("p->iPo < nPosNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilCex.c"
                ,0x197,"Abc_Cex_t *Abc_CexTransformPhase(Abc_Cex_t *, int, int, int)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformPhase( Abc_Cex_t * p, int nPisOld, int nPosOld, int nRegsOld )
{
    Abc_Cex_t * pCex;
    int nFrames = p->nPis / nPisOld;
    int nPosNew = nPosOld * nFrames;
    assert( p->nPis % nPisOld == 0 );
    assert( p->iPo < nPosNew );
    pCex = Abc_CexDup( p, nRegsOld );
    pCex->nPis   = nPisOld;
    pCex->iPo    = -1;
    pCex->iFrame = (p->iFrame + 1) * nFrames - 1;
    pCex->nBits  = p->nBits;
    return pCex;
}